

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O0

QString * QUtf32::convertToUnicode(QByteArrayView in,State *state,DataEndianness endian)

{
  QByteArrayView in_00;
  QChar *pQVar1;
  QChar *pQVar2;
  State *in_RCX;
  __off_t __length;
  QString *in_RDI;
  DataEndianness in_R8D;
  long in_FS_OFFSET;
  storage_type *unaff_retaddr;
  QChar *end;
  QString *result;
  qsizetype in_stack_ffffffffffffff68;
  QString *in_stack_ffffffffffffff70;
  QString *out;
  QByteArrayView local_18;
  qsizetype qVar3;
  
  qVar3 = *(qsizetype *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  out = in_RDI;
  QString::QString((QString *)0x5436ea);
  QByteArrayView::size(&local_18);
  QString::resize(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  QString::data(in_stack_ffffffffffffff70);
  in_00.m_data = unaff_retaddr;
  in_00.m_size = qVar3;
  pQVar1 = convertToUnicode((QChar *)out,in_00,in_RCX,in_R8D);
  pQVar2 = QString::constData((QString *)0x54376e);
  QString::truncate(in_RDI,(char *)((long)pQVar1 - (long)pQVar2 >> 1),__length);
  if (*(long *)(in_FS_OFFSET + 0x28) != qVar3) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QUtf32::convertToUnicode(QByteArrayView in, QStringConverter::State *state, DataEndianness endian)
{
    QString result;
    result.resize((in.size() + 7) >> 1); // worst case
    QChar *end = convertToUnicode(result.data(), in, state, endian);
    result.truncate(end - result.constData());
    return result;
}